

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall
QtMWidgets::DateTimePickerPrivate::setValue
          (DateTimePickerPrivate *this,QDateTime *dt,bool updateIndexes)

{
  QDateTime *this_00;
  QVector<Section> *this_01;
  char cVar1;
  int iVar2;
  int iVar3;
  reference pSVar4;
  long i;
  long lVar5;
  
  this_00 = &this->value;
  cVar1 = QDateTime::equals(this_00);
  if (cVar1 != '\0') {
    return;
  }
  cVar1 = QDateTime::precedes(dt);
  if (((cVar1 != '\0') || (cVar1 = QDateTime::precedes(&this->maximum), cVar1 != '\0')) &&
     (cVar1 = QDateTime::precedes(dt), dt = &this->minimum, cVar1 == '\0')) {
    dt = &this->maximum;
    cVar1 = QDateTime::precedes(dt);
    if (cVar1 == '\0') goto LAB_001596c0;
  }
  QDateTime::operator=(this_00,dt);
LAB_001596c0:
  fillValues(this,updateIndexes);
  if (((updateIndexes) || (cVar1 = QDateTime::equals(this_00), cVar1 == '\0')) &&
     (0 < (this->super_DateTimeParser).sections.d.size)) {
    this_01 = &(this->super_DateTimeParser).sections;
    lVar5 = 0;
    i = 0;
    do {
      iVar3 = *(int *)((long)&((this->super_DateTimeParser).sections.d.ptr)->type + lVar5);
      if (0x7f < iVar3) {
        if (iVar3 < 0x400) {
          if (iVar3 == 0x80) {
LAB_001597bb:
            QDateTime::date();
            iVar2 = QDate::day();
LAB_00159836:
            iVar2 = iVar2 + -1;
            goto LAB_001598d4;
          }
          if ((iVar3 == 0x100) || (iVar3 == 0x200)) goto LAB_00159822;
        }
        else {
          if (iVar3 == 0x400) {
LAB_00159822:
            QDateTime::date();
            iVar2 = QDate::month();
            goto LAB_00159836;
          }
          if ((iVar3 == 0x800) || (iVar3 == 0x1000)) {
            QDateTime::date();
            iVar2 = QDate::year();
            QDateTime::date();
            iVar3 = QDate::year();
            iVar2 = iVar2 - iVar3;
            goto LAB_001598d4;
          }
        }
        goto switchD_0015972c_caseD_3;
      }
      if (0xf < iVar3) {
        if (iVar3 == 0x10) {
          QDateTime::time();
          iVar2 = QTime::hour();
          goto LAB_001598d4;
        }
        if ((iVar3 == 0x20) || (iVar3 == 0x40)) goto LAB_001597bb;
        goto switchD_0015972c_caseD_3;
      }
      switch(iVar3) {
      case 1:
        QDateTime::time();
        iVar3 = QTime::hour();
        if (iVar3 != 0) {
          QDateTime::time();
          iVar3 = QTime::hour();
          if (iVar3 < 0xd) {
            pSVar4 = QList<QtMWidgets::Section>::operator[](this_01,i);
            pSVar4->currentIndex = 0;
            break;
          }
        }
        pSVar4 = QList<QtMWidgets::Section>::operator[](this_01,i);
        pSVar4->currentIndex = 1;
        break;
      case 2:
        QDateTime::time();
        iVar2 = QTime::second();
        goto LAB_001598d4;
      case 4:
        QDateTime::time();
        iVar2 = QTime::minute();
LAB_001598d4:
        pSVar4 = QList<QtMWidgets::Section>::operator[](this_01,i);
        pSVar4->currentIndex = iVar2;
        break;
      case 8:
        QDateTime::time();
        iVar3 = QTime::hour();
        if (iVar3 != 0) {
          QDateTime::time();
          iVar3 = QTime::hour();
          if (iVar3 < 0xd) {
            QDateTime::time();
            iVar2 = QTime::hour();
            goto LAB_00159836;
          }
          QDateTime::time();
          iVar2 = QTime::hour();
          iVar2 = iVar2 + -0xd;
          goto LAB_001598d4;
        }
        pSVar4 = QList<QtMWidgets::Section>::operator[](this_01,i);
        pSVar4->currentIndex = 0xb;
      }
switchD_0015972c_caseD_3:
      i = i + 1;
      lVar5 = lVar5 + 0x30;
    } while (i < (this->super_DateTimeParser).sections.d.size);
  }
  emitSignals(this);
  return;
}

Assistant:

void
DateTimePickerPrivate::setValue( const QDateTime & dt, bool updateIndexes )
{
	if( value != dt )
	{
		if( dt >= minimum && dt <= maximum )
			value = dt;
		else if( dt < minimum )
			value = minimum;
		else if( dt > maximum )
			value = maximum;

		fillValues( updateIndexes );

		if( updateIndexes || value != dt )
		{
			for( int i = 0; i < sections.size(); ++i )
			{
				switch( sections.at( i ).type )
				{
					case Section::AmPmSection :
					{
						if( value.time().hour() == 0 ||
							value.time().hour() > 12 )
								sections[ i ].currentIndex = 1;
						else
							sections[ i ].currentIndex = 0;
					}
					break;

					case Section::SecondSection :
					{
						sections[ i ].currentIndex = value.time().second();
					}
					break;

					case Section::MinuteSection :
					{
						sections[ i ].currentIndex = value.time().minute();
					}
					break;

					case Section::Hour12Section :
					{
						if( value.time().hour() == 0 )
							sections[ i ].currentIndex = 11;
						else if( value.time().hour() > 12 )
							sections[ i ].currentIndex = value.time().hour() - 12 - 1;
						else
							sections[ i ].currentIndex = value.time().hour() - 1;
					}
					break;

					case Section::Hour24Section :
					{
						sections[ i ].currentIndex = value.time().hour();
					}
					break;

					case Section::DaySection :
					case Section::DaySectionShort :
					case Section::DaySectionLong :
					{
						sections[ i ].currentIndex = value.date().day() - 1;
					}
					break;

					case Section::MonthSection :
					case Section::MonthSectionShort :
					case Section::MonthSectionLong :
					{
						sections[ i ].currentIndex = value.date().month() - 1;
					}
					break;

					case Section::YearSection :
					case Section::YearSection2Digits :
					{
						sections[ i ].currentIndex = value.date().year() -
							minimum.date().year();
					}
					break;

					default:
						break;
				}
			}
		}

		emitSignals();
	}
}